

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O3

uint64_t websocket_consume(void *buffer,uint64_t len,void *udata,uint8_t require_masking)

{
  byte bVar1;
  undefined1 uVar2;
  fio_write_args_s options;
  undefined1 uVar4;
  undefined1 *puVar3;
  char first;
  undefined1 uVar5;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  char text;
  long lVar16;
  byte *msg;
  long lVar17;
  byte *pbVar18;
  ws_s *ws;
  uchar in_stack_ffffffffffffff38;
  uint64_t local_98;
  uint64_t local_90;
  undefined8 local_88;
  uint7 uStack_37;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  
  if (len < 2) {
    local_88 = 2;
  }
  else {
    bVar1 = *(byte *)((long)buffer + 1) >> 7;
    lVar10 = (ulong)bVar1 * 4;
    uVar11 = *(byte *)((long)buffer + 1) & 0x7f;
    local_98 = (uint64_t)uVar11;
    if (uVar11 == 0x7f) {
      if (9 < len) {
        if (*(byte *)((long)buffer + 2) < 0x40) {
          local_98 = (ulong)*(byte *)((long)buffer + 9) |
                     (ulong)*(byte *)((long)buffer + 7) << 0x10 |
                     (ulong)*(byte *)((long)buffer + 6) << 0x18 |
                     (ulong)*(byte *)((long)buffer + 5) << 0x20 |
                     (ulong)*(byte *)((long)buffer + 4) << 0x28 |
                     (ulong)*(byte *)((long)buffer + 3) << 0x30 |
                     (ulong)*(byte *)((long)buffer + 2) << 0x38 |
                     (ulong)*(byte *)((long)buffer + 8) << 8;
          local_88 = (ulong)bVar1 * 0x100 + lVar10 + 10;
        }
        else {
          local_98 = 0;
          local_88 = 0;
        }
        goto LAB_0015e733;
      }
      local_88 = (ulong)bVar1 * 0x100 + lVar10 + 10;
    }
    else {
      if (uVar11 != 0x7e) {
        local_88 = (ulong)bVar1 * 0x100 + lVar10 + 2;
        goto LAB_0015e733;
      }
      if (3 < len) {
        local_98 = (uint64_t)
                   (ushort)(*(ushort *)((long)buffer + 2) << 8 | *(ushort *)((long)buffer + 2) >> 8)
        ;
        local_88 = (ulong)bVar1 * 0x100 + lVar10 + 4;
        goto LAB_0015e733;
      }
      local_88 = (ulong)bVar1 * 0x100 + lVar10 + 4;
    }
  }
  local_98 = 0;
LAB_0015e733:
  if ((char)local_88 == '\0') {
    fio_close(*(intptr_t *)((long)udata + 0x30));
LAB_0015e7d7:
    local_90 = 0;
  }
  else {
    local_90 = len;
    if ((local_88 & 0xff) + local_98 <= len) {
      pbVar18 = (byte *)buffer;
      if ((local_88 & 0xff) + local_98 <= len) {
        do {
          msg = pbVar18 + (local_88 & 0xff);
          if (local_88._1_1_ == '\0') {
            if ((require_masking != '\0') && (local_98 != 0)) {
              fio_close(*(intptr_t *)((long)udata + 0x30));
            }
          }
          else {
            websocket_xmask(msg,local_98,*(uint32_t *)(msg + -4));
          }
          switch(*pbVar18 & 0xf) {
          case 0:
            first = '\0';
            goto LAB_0015e8fc;
          case 1:
            first = '\x01';
            text = '\x01';
            goto LAB_0015e8ff;
          case 2:
            first = '\x01';
LAB_0015e8fc:
            text = '\0';
LAB_0015e8ff:
            websocket_on_unwrapped
                      (udata,msg,local_98,first,*pbVar18 >> 7,text,in_stack_ffffffffffffff38);
            break;
          default:
            fio_close(*(intptr_t *)((long)udata + 0x30));
            break;
          case 9:
            puVar3 = (undefined1 *)malloc(local_98 + 0x10);
            uVar5 = (undefined1)(local_98 >> 0x18);
            uVar4 = (undefined1)(local_98 >> 8);
            uVar6 = (undefined1)(local_98 >> 0x20);
            uVar7 = (undefined1)(local_98 >> 0x28);
            uVar8 = (undefined1)(local_98 >> 0x30);
            uVar9 = (undefined1)(local_98 >> 0x38);
            uVar2 = (undefined1)(local_98 >> 0x10);
            if (*(char *)((long)udata + 0xb1) == '\0') {
              *puVar3 = 0x8a;
              if (local_98 < 0x7e) {
                lVar17 = 2;
                lVar10 = 1;
              }
              else if (local_98 < 0x10000) {
                puVar3[1] = 0x7e;
                puVar3[2] = uVar4;
                lVar17 = 4;
                lVar10 = 3;
              }
              else {
                puVar3[1] = 0x7f;
                puVar3[2] = uVar9;
                puVar3[3] = uVar8;
                puVar3[4] = uVar7;
                puVar3[5] = uVar6;
                puVar3[6] = uVar5;
                puVar3[7] = uVar2;
                puVar3[8] = uVar4;
                lVar17 = 10;
                lVar10 = 9;
              }
              puVar3[lVar10] = (byte)local_98;
              memcpy(puVar3 + lVar17,msg,local_98);
            }
            else {
              uVar11 = rand();
              *puVar3 = 0x8a;
              if (local_98 < 0x7e) {
                lVar17 = 6;
                lVar16 = 5;
                lVar10 = 4;
                lVar12 = 3;
                lVar13 = 2;
                lVar15 = 1;
                uVar14 = (ulong)(byte)((byte)local_98 | 0x80);
              }
              else {
                uVar14 = local_98;
                if (local_98 < 0x10000) {
                  puVar3[1] = 0xfe;
                  puVar3[2] = uVar4;
                  lVar17 = 8;
                  lVar16 = 7;
                  lVar10 = 6;
                  lVar12 = 5;
                  lVar13 = 4;
                  lVar15 = 3;
                }
                else {
                  puVar3[1] = 0xff;
                  puVar3[2] = uVar9;
                  puVar3[3] = uVar8;
                  puVar3[4] = uVar7;
                  puVar3[5] = uVar6;
                  puVar3[6] = uVar5;
                  puVar3[7] = uVar2;
                  puVar3[8] = uVar4;
                  lVar17 = 0xe;
                  lVar16 = 0xd;
                  lVar10 = 0xc;
                  lVar12 = 0xb;
                  lVar13 = 10;
                  lVar15 = 9;
                }
              }
              uVar11 = uVar11 | 0x1020408;
              puVar3[lVar15] = (char)uVar14;
              puVar3[lVar13] = (char)uVar11;
              puVar3[lVar12] = (char)(uVar11 >> 8);
              puVar3[lVar10] = (char)(uVar11 >> 0x10);
              puVar3[lVar16] = (char)(uVar11 >> 0x18);
              memcpy(puVar3 + lVar17,msg,local_98);
              websocket_xmask(puVar3 + lVar17,local_98,uVar11);
            }
            in_stack_ffffffffffffff38 = (uchar)puVar3;
            options.after.dealloc = (_func_void_void_ptr *)0x0;
            options.data.fd = (intptr_t)puVar3;
            options.length = lVar17 + local_98;
            options.offset = 0;
            options._32_8_ = (ulong)uStack_37 << 8;
            fio_write2_fn(*(intptr_t *)((long)udata + 0x30),options);
            break;
          case 10:
          }
          local_90 = local_90 - ((local_88 & 0xff) + local_98);
          if (local_90 == 0) goto LAB_0015e7d7;
          pbVar18 = pbVar18 + (local_88 & 0xff) + local_98;
          if (local_90 == 1) {
            local_88 = 2;
LAB_0015eb88:
            local_98 = 0;
          }
          else {
            bVar1 = pbVar18[1] >> 7;
            lVar10 = (ulong)bVar1 * 4;
            uVar11 = pbVar18[1] & 0x7f;
            local_98 = (uint64_t)uVar11;
            if (uVar11 == 0x7f) {
              if (local_90 < 10) {
                local_88 = (ulong)bVar1 * 0x100 + lVar10 + 10;
                goto LAB_0015eb88;
              }
              if (pbVar18[2] < 0x40) {
                local_98 = (ulong)pbVar18[9] |
                           (ulong)pbVar18[7] << 0x10 |
                           (ulong)pbVar18[6] << 0x18 |
                           (ulong)pbVar18[5] << 0x20 |
                           (ulong)pbVar18[4] << 0x28 |
                           (ulong)pbVar18[3] << 0x30 | (ulong)pbVar18[2] << 0x38 |
                           (ulong)pbVar18[8] << 8;
                local_88 = (ulong)bVar1 * 0x100 + lVar10 + 10;
              }
              else {
                local_98 = 0;
                local_88 = 0;
              }
            }
            else if (uVar11 == 0x7e) {
              if (local_90 < 4) {
                local_88 = (ulong)bVar1 * 0x100 + lVar10 + 4;
                goto LAB_0015eb88;
              }
              local_98 = (uint64_t)
                         (ushort)(*(ushort *)(pbVar18 + 2) << 8 | *(ushort *)(pbVar18 + 2) >> 8);
              local_88 = (ulong)bVar1 * 0x100 + lVar10 + 4;
            }
            else {
              local_88 = (ulong)bVar1 * 0x100 + lVar10 + 2;
            }
          }
        } while ((local_88 & 0xff) + local_98 <= local_90);
      }
      memmove(buffer,(void *)((long)buffer + (len - local_90)),local_90);
    }
  }
  return local_90;
}

Assistant:

static uint64_t websocket_consume(void *buffer, uint64_t len, void *udata,
                                  uint8_t require_masking) {
  volatile struct websocket_packet_info_s info =
      websocket_buffer_peek(buffer, len);
  if (!info.head_length) {
#if DEBUG
    fprintf(stderr, "ERROR: WebSocket protocol error - malicious header.\n");
#endif
    websocket_on_protocol_error(udata);
    return 0;
  }
  if (info.head_length + info.packet_length > len)
    return len;
  uint64_t reminder = len;
  uint8_t *pos = (uint8_t *)buffer;
  while (info.head_length + info.packet_length <= reminder) {
    /* parse head */
    void *payload = (void *)(pos + info.head_length);
    /* unmask? */
    if (info.masked) {
      /* masked */
      uint32_t mask; // = ((uint32_t *)payload)[-1];
      ((uint8_t *)(&mask))[0] = ((uint8_t *)(payload))[-4];
      ((uint8_t *)(&mask))[1] = ((uint8_t *)(payload))[-3];
      ((uint8_t *)(&mask))[2] = ((uint8_t *)(payload))[-2];
      ((uint8_t *)(&mask))[3] = ((uint8_t *)(payload))[-1];
      websocket_xmask(payload, info.packet_length, mask);
    } else if (require_masking && info.packet_length) {
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unmasked data.\n");
#endif
      websocket_on_protocol_error(udata);
    }
    /* call callback */
    switch (pos[0] & 15) {
    case 0:
      /* continuation frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 0,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 1:
      /* text frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 1, ((pos[0] >> 4) & 7));
      break;
    case 2:
      /* data frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 8:
      /* close frame */
      websocket_on_protocol_close(udata);
      break;
    case 9:
      /* ping frame */
      websocket_on_protocol_ping(udata, payload, info.packet_length);
      break;
    case 10:
      /* pong frame */
      websocket_on_protocol_pong(udata, payload, info.packet_length);
      break;
    default:
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unknown opcode %u\n",
              (unsigned int)(pos[0] & 15));
#endif
      websocket_on_protocol_error(udata);
    }
    /* step forward */
    reminder = reminder - (info.head_length + info.packet_length);
    if (!reminder)
      return 0;
    pos += info.head_length + info.packet_length;
    info = websocket_buffer_peek(pos, reminder);
  }
  /* reset buffer state - support pipelining */
  memmove(buffer, (uint8_t *)buffer + len - reminder, reminder);
  return reminder;
}